

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

_Bool av1_rd_pick_partition
                (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                int mi_row,int mi_col,BLOCK_SIZE bsize,RD_STATS *rd_cost,RD_STATS best_rdc,
                PC_TREE *pc_tree,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t *none_rd,
                SB_MULTI_PASS_MODE multi_pass_mode,RD_RECT_PART_WIN_INFO *rect_part_win_info)

{
  PC_TREE_SHARED_BUFFERS *shared_bufs;
  int *costs;
  aom_cdf_prob aVar1;
  int iVar2;
  SequenceHeader *pSVar3;
  FRAME_CONTEXT *pFVar4;
  long *plVar5;
  MB_MODE_INFO *pMVar6;
  int num_planes;
  RD_STATS best_rdc_00;
  RD_STATS best_rdcost;
  RD_STATS best_rd;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  SPEED_FEATURES *pSVar10;
  BLOCK_SIZE BVar11;
  BLOCK_SIZE BVar12;
  int8_t iVar13;
  _Bool _Var14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  PC_TREE *pPVar20;
  SIMPLE_MOTION_DATA_TREE *sms_tree_00;
  PICK_MODE_CONTEXT *pPVar21;
  PICK_MODE_CONTEXT **ppPVar22;
  PARTITION_TYPE partition;
  short sVar23;
  uint uVar24;
  uint uVar25;
  int *inv_map;
  int i_1;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  RD_RECT_PART_WIN_INFO *pRVar30;
  BLOCK_SIZE BVar31;
  BLOCK_SIZE BVar32;
  int64_t iVar33;
  ulong uVar34;
  PART4_TYPES i_4;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  BLOCK_SIZE *pBVar38;
  int64_t *none_rd_00;
  double *pdVar39;
  AV1_COMP *pAVar40;
  byte bVar41;
  int iVar42;
  ulong uVar43;
  long lVar44;
  bool bVar45;
  bool bVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 uVar49;
  undefined7 uVar50;
  AV1_COMP *pAVar51;
  AV1_COMP *pAVar52;
  long local_530;
  undefined4 local_518;
  undefined4 uStack_514;
  int part4_search_allowed [2];
  uint local_4b0;
  PartitionSearchState part_search_state;
  undefined1 local_358 [16];
  PICK_MODE_CONTEXT *local_348;
  long local_340;
  PICK_MODE_CONTEXT **local_338;
  PICK_MODE_CONTEXT **local_330;
  ulong local_328;
  MACROBLOCKD *local_320;
  int local_318;
  uint local_314;
  undefined1 local_310 [16];
  long lStack_300;
  int64_t local_2f8;
  uint8_t local_2f0;
  undefined7 uStack_2ef;
  double var_max_1;
  PICK_MODE_CONTEXT **appPStack_2e0 [5];
  PICK_MODE_CONTEXT **local_2b8;
  double var_max;
  undefined8 uStack_2a0;
  ulong local_298;
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  int local_270;
  int iStack_26c;
  int iStack_268;
  int iStack_264;
  undefined1 local_260 [16];
  undefined8 local_250;
  SuperBlockEnc *local_240;
  PICK_MODE_CONTEXT **local_238;
  PICK_MODE_CONTEXT **local_230;
  int local_228;
  undefined8 local_224;
  undefined4 local_21c;
  int local_218;
  undefined4 local_214;
  int local_210;
  undefined4 local_20c;
  PICK_MODE_CONTEXT **local_208;
  PICK_MODE_CONTEXT **local_200;
  PICK_MODE_CONTEXT **local_1f8;
  PICK_MODE_CONTEXT **local_1f0;
  PICK_MODE_CONTEXT **local_1e8;
  buf_2d *local_1e0;
  PICK_MODE_CONTEXT **local_1d8;
  ModeCosts *local_1d0;
  PICK_MODE_CONTEXT **cur_part_ctxs [4];
  int ab_partitions_allowed [4];
  BLOCK_SIZE local_18c;
  BLOCK_SIZE local_18b;
  BLOCK_SIZE local_18a;
  BLOCK_SIZE local_189;
  undefined4 local_188;
  BLOCK_SIZE local_184;
  BLOCK_SIZE local_183;
  BLOCK_SIZE local_182;
  BLOCK_SIZE local_181;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  uVar36 = (ulong)bsize;
  pSVar3 = (cpi->common).seq_params;
  uVar17 = (uint)(pSVar3->monochrome == '\0');
  part_search_state.part_blk_params.mi_step =
       (int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar36] >>
            1);
  iVar42 = mi_row + part_search_state.part_blk_params.mi_step;
  iVar28 = part_search_state.part_blk_params.mi_step + mi_col;
  part_search_state.part_blk_params.width = (int)block_size_wide[uVar36];
  part_search_state.part_blk_params.min_partition_size_1d =
       (int)block_size_wide[(td->mb).sb_enc.min_partition_size];
  local_320 = &(td->mb).e_mbd;
  part_search_state.part_blk_params.mi_row = mi_row;
  part_search_state.part_blk_params.mi_col = mi_col;
  part_search_state.part_blk_params.mi_row_edge = iVar42;
  part_search_state.part_blk_params.mi_col_edge = iVar28;
  part_search_state.part_blk_params.subsize = get_partition_subsize(bsize,'\x03');
  uVar25 = (uint)(BLOCK_8X4 < bsize);
  part_search_state.part_blk_params.bsize = bsize;
  iVar16 = (cpi->common).mi_params.mi_rows;
  part_search_state.part_blk_params.has_rows = (int)(iVar42 < iVar16);
  iVar2 = (cpi->common).mi_params.mi_cols;
  part_search_state.part_blk_params.has_cols = (int)(iVar28 < iVar2);
  part_search_state.intra_part_info = &(td->mb).part_search_info;
  part_search_state.part_blk_params.bsize_at_least_8x8 = uVar25;
  part_search_state.part_blk_params.split_bsize2 = part_search_state.part_blk_params.subsize;
  if ((bsize == BLOCK_64X64) && (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    (td->mb).part_search_info.quad_tree_idx = 0;
    (td->mb).part_search_info.cnn_output_valid = 0;
LAB_001cee4b:
    part_search_state.pl_ctx_idx = partition_plane_context(local_320,mi_row,mi_col,bsize);
  }
  else {
    part_search_state.pl_ctx_idx = 0;
    if (BLOCK_8X4 < bsize) goto LAB_001cee4b;
  }
  local_240 = &(td->mb).sb_enc;
  num_planes = uVar17 * 2 + 1;
  local_1d0 = &(td->mb).mode_costs;
  part_search_state.partition_cost =
       (td->mb).mode_costs.partition_cost[part_search_state.pl_ctx_idx];
  for (lVar19 = 7; lVar19 != 0xb; lVar19 = lVar19 + 1) {
    *(undefined8 *)part_search_state.split_part_rect_win[lVar19 + -7].rect_part_win = 0x100000001;
  }
  part_search_state.this_rdc.rate = 0;
  part_search_state.this_rdc.zero_rate = 0;
  part_search_state.this_rdc.dist = 0;
  part_search_state.this_rdc.rdcost = 0;
  part_search_state.this_rdc.sse = 0;
  part_search_state.this_rdc.skip_txfm = '\x01';
  part_search_state.none_rd = 0;
  part_search_state.split_rd[0] = 0;
  part_search_state.split_rd[1] = 0;
  part_search_state.split_rd[2] = 0;
  part_search_state.split_rd[3] = 0;
  part_search_state.rect_part_rd[0][0] = 0;
  part_search_state.rect_part_rd[0][1] = 0;
  part_search_state.rect_part_rd[1][0] = 0;
  part_search_state.is_rect_ctx_is_ready[0] = 0;
  part_search_state.is_rect_ctx_is_ready[1] = 0;
  part_search_state.rect_part_rd[1][1] = 0;
  part_search_state.is_split_ctx_is_ready[0] = 0;
  part_search_state.is_split_ctx_is_ready[1] = 0;
  iVar18 = (td->mb).e_mbd.plane[1].subsampling_x;
  iVar35 = (td->mb).e_mbd.plane[1].subsampling_y;
  part_search_state.partition_rect_allowed[0] = 0;
  if ((cpi->oxcf).part_cfg.enable_rect_partitions == false) {
    uVar25 = part_search_state.partition_rect_allowed[0];
  }
  part_search_state.prune_rect_part[0] = 0;
  part_search_state.prune_rect_part[1] = 0;
  part_search_state.do_square_split._0_1_ = BLOCK_8X4 < bsize;
  part_search_state.do_rectangular_split = uVar25;
  part_search_state.do_square_split._1_3_ = 0;
  uVar17 = (uint)(iVar28 < iVar2);
  if (iVar16 <= iVar42) {
    uVar17 = 0;
  }
  part_search_state._280_8_ = (ulong)uVar17 << 0x20;
  part_search_state.ss_x = iVar18;
  part_search_state.ss_y = iVar35;
  if (uVar25 == 0) {
    part_search_state.partition_rect_allowed[0] = 0;
    part_search_state.partition_rect_allowed[1] = 0;
  }
  else {
    if (iVar28 < iVar2) {
      BVar11 = get_partition_subsize(bsize,'\x01');
      part_search_state.partition_rect_allowed[0] =
           (int)(av1_ss_size_lookup[BVar11][iVar18][iVar35] != BLOCK_INVALID);
    }
    part_search_state.partition_rect_allowed[1] = 0;
    if (iVar42 < iVar16) {
      BVar11 = get_partition_subsize(bsize,'\x02');
      part_search_state.partition_rect_allowed[1] =
           (int)(av1_ss_size_lookup[BVar11][iVar18][iVar35] != BLOCK_INVALID);
    }
  }
  iVar18 = part_search_state.pl_ctx_idx;
  part_search_state.found_best_partition = false;
  if (sms_tree != (SIMPLE_MOTION_DATA_TREE *)0x0) {
    sms_tree->partitioning = '\0';
  }
  if (best_rdc.rdcost._4_4_ < 0) {
    rd_cost->rate = 0x7fffffff;
    rd_cost->zero_rate = 0;
    rd_cost->dist = 0x7fffffffffffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
    rd_cost->sse = 0x7fffffffffffffff;
    rd_cost->skip_txfm = '\0';
    return (_Bool)0;
  }
  if (pSVar3->sb_size == bsize) {
    (td->mb).must_find_valid_partition = 0;
  }
  if (none_rd != (int64_t *)0x0) {
    *none_rd = 0;
  }
  pAVar51 = cpi;
  if (iVar16 <= iVar42 || iVar2 <= iVar28) {
    pFVar4 = (cpi->common).fc;
    costs = part_search_state.tmp_partition_cost;
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      part_search_state.tmp_partition_cost[lVar19] = 0x1e00;
    }
    if (iVar28 < iVar2) {
      aVar1 = pFVar4->partition_cdf[iVar18][2];
      sVar23 = (((aVar1 - pFVar4->partition_cdf[iVar18][1]) + pFVar4->partition_cdf[iVar18][4]) -
               (aVar1 + pFVar4->partition_cdf[iVar18][5])) + pFVar4->partition_cdf[iVar18][7] +
               -0x8000;
      if (bsize != BLOCK_128X128) {
        sVar23 = (sVar23 - pFVar4->partition_cdf[iVar18][8]) + pFVar4->partition_cdf[iVar18][9];
      }
      inv_map = (int *)&set_partition_cost_for_edge_blk_bot_inv_map;
    }
    else {
      if (iVar16 <= iVar42) {
        part_search_state.tmp_partition_cost[3] = 0;
        part_search_state.partition_cost = costs;
        goto LAB_001cf208;
      }
      sVar23 = ((pFVar4->partition_cdf[iVar18][1] - pFVar4->partition_cdf[iVar18][0] ^ 0x8000) -
               pFVar4->partition_cdf[iVar18][2]) + pFVar4->partition_cdf[iVar18][6];
      if (bsize != BLOCK_128X128) {
        sVar23 = (sVar23 - pFVar4->partition_cdf[iVar18][7]) + pFVar4->partition_cdf[iVar18][8];
      }
      inv_map = (int *)&set_partition_cost_for_edge_blk_rhs_inv_map;
    }
    x_ctx.a._0_2_ = -0x8000 - sVar23;
    x_ctx.a[2] = '\0';
    x_ctx.a[3] = '\0';
    av1_cost_tokens_from_cdf(costs,(aom_cdf_prob *)&x_ctx,inv_map);
    part_search_state.partition_cost = costs;
  }
LAB_001cf208:
  if ((cpi->sf).part_sf.use_square_partition_only_threshold < bsize) {
    part_search_state.partition_rect_allowed[0] = part_search_state.partition_rect_allowed[0] & 1;
    if (iVar42 < iVar16) {
      part_search_state.partition_rect_allowed[0] = 0;
    }
    part_search_state.partition_rect_allowed[1] = part_search_state.partition_rect_allowed[1] & 1;
    if (iVar28 < iVar2) {
      part_search_state.partition_rect_allowed[1] = 0;
    }
  }
  av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  if (((cpi->oxcf).mode == '\x02') && (((cpi->common).seq_params)->sb_size == bsize)) {
    log_sub_block_var(cpi,&td->mb,bsize,(double *)&x_ctx,&var_max);
    (td->mb).intra_sb_rdmult_modifier = 0x80;
    dVar47 = (double)CONCAT44(x_ctx.a._4_4_,CONCAT22(x_ctx.a._2_2_,x_ctx.a._0_2_));
    if ((dVar47 < 2.0) && (4.0 < var_max)) {
      dVar47 = var_max - dVar47;
      iVar16 = 0x50;
      if (dVar47 <= 8.0) {
        iVar16 = 0x80 - (int)(dVar47 * 6.0);
      }
      (td->mb).intra_sb_rdmult_modifier = iVar16;
    }
  }
  local_318 = (td->mb).rdmult;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  av1_rd_cost_update((td->mb).rdmult,&best_rdc);
  if ((bsize == BLOCK_16X16) && (cpi->vaq_refresh != 0)) {
    iVar16 = av1_log_block_var(cpi,&td->mb,BLOCK_16X16);
    (td->mb).mb_energy = iVar16;
  }
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,num_planes);
  av1_prune_partitions_before_search(cpi,&td->mb,sms_tree,&part_search_state);
  av1_prune_partitions_by_max_min_bsize(local_240,&part_search_state);
  shared_bufs = &td->shared_coeff_buf;
  local_330 = pc_tree->horizontal;
  local_230 = pc_tree->horizontal + 1;
  local_338 = pc_tree->vertical;
  local_238 = pc_tree->vertical + 1;
  local_1e0 = &(td->mb).plane[0].src;
  local_1e8 = pc_tree->horizontala;
  local_1f0 = pc_tree->horizontalb;
  local_1f8 = pc_tree->verticala;
  local_200 = pc_tree->verticalb;
  local_208 = pc_tree->horizontal4;
  local_1d8 = pc_tree->vertical4;
  if ((td->mb).must_find_valid_partition == 0) goto LAB_001cf613;
  do {
    BVar11 = part_search_state.part_blk_params.bsize;
    iVar16 = part_search_state.part_blk_params.has_rows;
    uVar25 = 0;
    bVar41 = 0;
    if (part_search_state.part_blk_params.bsize_at_least_8x8 != 0) {
      bVar41 = part_search_state.part_blk_params.min_partition_size_1d <
               part_search_state.part_blk_params.width &
               (pAVar51->oxcf).part_cfg.enable_rect_partitions;
    }
    part_search_state.do_square_split._0_1_ =
         part_search_state.part_blk_params.min_partition_size_1d <
         part_search_state.part_blk_params.width &&
         part_search_state.part_blk_params.bsize_at_least_8x8 != 0;
    part_search_state.do_square_split._1_3_ = 0;
    part_search_state.partition_none_allowed._0_1_ =
         (part_search_state.part_blk_params.has_cols != 0 &&
         part_search_state.part_blk_params.has_rows != 0) &&
         part_search_state.part_blk_params.min_partition_size_1d <=
         part_search_state.part_blk_params.width;
    part_search_state.partition_none_allowed._1_3_ = 0;
    cpi = pAVar51;
    if ((part_search_state.part_blk_params.has_cols != 0) && (bVar41 != 0)) {
      BVar12 = get_partition_subsize(part_search_state.part_blk_params.bsize,'\x01');
      uVar25 = (uint)(av1_ss_size_lookup[BVar12][part_search_state.ss_x][part_search_state.ss_y] !=
                     BLOCK_INVALID);
      cpi = pAVar51;
    }
    uVar17 = 0;
    part_search_state.partition_rect_allowed[0] = uVar25;
    if ((iVar16 != 0 & bVar41) == 1) {
      BVar11 = get_partition_subsize(BVar11,'\x02');
      uVar17 = (uint)(av1_ss_size_lookup[BVar11][part_search_state.ss_x][part_search_state.ss_y] !=
                     BLOCK_INVALID);
    }
    part_search_state._280_8_ = part_search_state._280_8_ & 0xffffffff00000000;
    part_search_state.partition_rect_allowed[1] = uVar17;
    av1_prune_partitions_by_max_min_bsize(local_240,&part_search_state);
    pAVar51 = cpi;
    if ((bsize == BLOCK_64X64) && (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
      (part_search_state.intra_part_info)->quad_tree_idx = 0;
      (part_search_state.intra_part_info)->cnn_output_valid = 0;
    }
LAB_001cf613:
    if ((cpi->oxcf).mode == '\x02') {
      bVar45 = false;
      if ((cpi->sf).part_sf.prune_rect_part_using_4x4_var_deviation == true) {
        bVar45 = (td->mb).must_find_valid_partition == 0;
      }
      if (BLOCK_16X8 < bsize || bVar45) {
        log_sub_block_var(cpi,&td->mb,bsize,&var_max,&var_max_1);
        if (((bsize < BLOCK_16X16) || (0.272 <= var_max)) || (var_max_1 - var_max <= 3.0)) {
          if ((bVar45) && (var_max_1 - var_max < 3.0)) {
            part_search_state._296_8_ = part_search_state._296_8_ & 0xffffffff00000000;
          }
        }
        else {
          part_search_state.terminate_partition_search = 0;
          part_search_state.partition_none_allowed = 0;
          part_search_state.do_square_split = 1;
        }
      }
    }
    BVar11 = part_search_state.part_blk_params.bsize;
    iVar18 = part_search_state.part_blk_params.bsize_at_least_8x8;
    iVar42 = part_search_state.part_blk_params.mi_col;
    iVar16 = part_search_state.part_blk_params.mi_row;
    local_4b0 = 0xffffffff;
    bVar45 = true;
    if (part_search_state.terminate_partition_search == 0) {
      bVar45 = false;
      if (part_search_state.partition_none_allowed == 0) goto LAB_001cf711;
      var_max_1 = 1.06099789498857e-314;
      appPStack_2e0[0] = (PICK_MODE_CONTEXT **)0x7fffffffffffffff;
      appPStack_2e0[1] = (PICK_MODE_CONTEXT **)0x7fffffffffffffff;
      appPStack_2e0[2] = (PICK_MODE_CONTEXT **)0x7fffffffffffffff;
      appPStack_2e0[3] = (PICK_MODE_CONTEXT **)((ulong)appPStack_2e0[3] & 0xffffffffffffff00);
      cpi = pAVar51;
      if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
        pPVar21 = av1_alloc_pmc(pAVar51,part_search_state.part_blk_params.bsize,shared_bufs);
        pc_tree->none = pPVar21;
        cpi = pAVar51;
        if (pPVar21 == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
          cpi = pAVar51;
        }
      }
      uVar25 = 0;
      if (part_search_state.partition_none_allowed != 0) {
        uVar25 = 0;
        if (iVar18 != 0) {
          uVar25 = 0;
          if (*part_search_state.partition_cost != 0x7fffffff) {
            uVar25 = *part_search_state.partition_cost;
          }
        }
        local_298 = 0;
        auStack_290._0_9_ = (unkuint9)1 << 0x40;
        _var_max = ZEXT416(uVar25);
        iVar35 = (td->mb).rdmult;
        av1_rd_cost_update(iVar35,(RD_STATS *)&var_max);
        av1_rd_stats_subtraction(iVar35,&best_rdc,(RD_STATS *)&var_max,(RD_STATS *)&var_max_1);
      }
      best_rd.dist._0_4_ = (int)appPStack_2e0[0];
      best_rd._0_8_ = var_max_1;
      best_rd.dist._4_4_ = (int)((ulong)appPStack_2e0[0] >> 0x20);
      best_rd.rdcost._0_1_ = (char)appPStack_2e0[1];
      best_rd.rdcost._1_7_ = (int7)((ulong)appPStack_2e0[1] >> 8);
      best_rd.sse._0_4_ = (int)appPStack_2e0[2];
      best_rd.sse._4_4_ = (int)((ulong)appPStack_2e0[2] >> 0x20);
      best_rd.skip_txfm = (char)appPStack_2e0[3];
      best_rd._33_7_ = (int7)((ulong)appPStack_2e0[3] >> 8);
      pick_sb_modes(cpi,tile_data,&td->mb,iVar16,iVar42,&part_search_state.this_rdc,'\0',BVar11,
                    pc_tree->none,best_rd);
      av1_rd_cost_update((td->mb).rdmult,&part_search_state.this_rdc);
      local_4b0 = (td->mb).source_variance;
      if (none_rd != (int64_t *)0x0) {
        *none_rd = part_search_state.this_rdc.rdcost;
      }
      part_search_state.none_rd = part_search_state.this_rdc.rdcost;
      iVar33 = 0x7fffffffffffffff;
      if (part_search_state.this_rdc.rate != 0x7fffffff) {
        if ((cpi->sf).inter_sf.prune_ref_frame_for_rect_partitions != 0) {
          pAVar51 = cpi;
          iVar13 = av1_ref_frame_type((pc_tree->none->mic).ref_frame);
          av1_update_picked_ref_frames_mask
                    (&td->mb,(int)iVar13,BVar11,((cpi->common).seq_params)->mib_size,iVar16,iVar42);
          cpi = pAVar51;
        }
        BVar12 = part_search_state.part_blk_params.bsize;
        iVar29 = part_search_state.part_blk_params.has_cols;
        iVar35 = part_search_state.part_blk_params.has_rows;
        if (iVar18 != 0) {
          lVar19 = (long)part_search_state.this_rdc.rate;
          part_search_state.this_rdc.rate = (int)((int)uVar25 + lVar19);
          part_search_state.this_rdc.rdcost =
               part_search_state.this_rdc.dist * 0x80 +
               ((long)(td->mb).rdmult * ((int)uVar25 + lVar19) + 0x100 >> 9);
        }
        iVar33 = part_search_state.this_rdc.rdcost;
        if (part_search_state.this_rdc.rdcost < best_rdc.rdcost) {
          best_rdc._33_7_ = part_search_state.this_rdc._33_7_;
          best_rdc.skip_txfm = part_search_state.this_rdc.skip_txfm;
          best_rdc.rdcost._0_4_ = (undefined4)part_search_state.this_rdc.rdcost;
          best_rdc.rdcost._4_4_ = (int)((ulong)part_search_state.this_rdc.rdcost >> 0x20);
          best_rdc.sse._0_4_ = (undefined4)part_search_state.this_rdc.sse;
          best_rdc.sse._4_4_ = (undefined4)((ulong)part_search_state.this_rdc.sse >> 0x20);
          best_rdc.rate = part_search_state.this_rdc.rate;
          best_rdc.zero_rate = part_search_state.this_rdc.zero_rate;
          best_rdc.dist = part_search_state.this_rdc.dist;
          part_search_state.found_best_partition = true;
          if (iVar18 != 0) {
            pc_tree->partitioning = '\0';
          }
          uVar37 = (ulong)part_search_state.part_blk_params.bsize;
          if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
            if (((part_search_state.do_rectangular_split != 0 ||
                  part_search_state.do_square_split != 0) &&
                ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0)) &&
               (pc_tree->none->skippable != 0)) {
              pAVar51 = cpi;
              if (((byte)(part_search_state.part_blk_params.bsize - BLOCK_4X8) <
                   (cpi->sf).part_sf.use_square_partition_only_threshold) &&
                 (0 < (cpi->sf).part_sf.ml_predict_breakout_level)) {
                av1_ml_predict_breakout
                          (cpi,&td->mb,&part_search_state.this_rdc,local_4b0,(td->mb).e_mbd.bd,
                           &part_search_state);
              }
              pSVar10 = &cpi->sf;
              cpi = pAVar51;
              if ((best_rdc.dist <
                   (pSVar10->part_sf).partition_search_breakout_dist_thr >>
                   (10 - (""[uVar37] + ""[uVar37]) & 0x3f)) &&
                 (best_rdc.rate <
                  (int)((uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar37] *
                       (pAVar51->sf).part_sf.partition_search_breakout_rate_thr))) {
                part_search_state.do_rectangular_split = 0;
                part_search_state.do_square_split = 0;
              }
            }
          }
          best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost);
          if (((((((cpi->sf).part_sf.simple_motion_search_early_term_none != 0) &&
                 (best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
                 (cpi->common).show_frame != 0)) &&
                (best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
                ((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
               ((best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
                BLOCK_16X8 < BVar12 &&
                (best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
                iVar35 != 0)))) &&
              (best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
              iVar29 != 0)) &&
             ((best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
              (ulong)part_search_state.this_rdc.rdcost < 0x7fffffffffffffff &&
              (best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost),
              (uint)part_search_state.this_rdc.rate < 0x7fffffff)))) {
            best_rdc.rdcost = CONCAT44(best_rdc.rdcost._4_4_,(undefined4)best_rdc.rdcost);
            if (part_search_state.do_rectangular_split != 0 ||
                part_search_state.do_square_split != 0) {
              av1_simple_motion_search_early_term_none
                        (cpi,&td->mb,sms_tree,&part_search_state.this_rdc,&part_search_state);
            }
          }
        }
        if ((cpi->sf).part_sf.prune_rect_part_using_none_pred_mode == true) {
          bVar41 = (pc_tree->none->mic).mode;
          if (bVar41 < 10) {
            if ((0xc4U >> (bVar41 & 0x1f) & 1) == 0) {
              if ((0x122U >> (bVar41 & 0x1f) & 1) == 0) {
                if (((0x201U >> (bVar41 & 0x1f) & 1) != 0) &&
                   ((((td->mb).e_mbd.left_available == true &&
                     (BVar12 = ((td->mb).e_mbd.left_mbmi)->bsize,
                     (uint)block_size_wide[BVar11] * (uint)block_size_high[BVar11] <
                     (uint)block_size_wide[BVar12] * (uint)block_size_high[BVar12])) ||
                    (((td->mb).e_mbd.up_available == true &&
                     (BVar12 = ((td->mb).e_mbd.above_mbmi)->bsize,
                     (uint)block_size_wide[BVar11] * (uint)block_size_high[BVar11] <
                     (uint)block_size_wide[BVar12] * (uint)block_size_high[BVar12])))))) {
                  part_search_state.prune_rect_part[0] = 1;
                  part_search_state.prune_rect_part[1] = 1;
                }
              }
              else {
                part_search_state.prune_rect_part[0] = 1;
              }
            }
            else {
              part_search_state.prune_rect_part[1] = 1;
            }
          }
        }
      }
      bVar45 = ((cpi->common).seq_params)->monochrome == '\0';
      pAVar51 = cpi;
      av1_restore_context(&td->mb,&x_ctx,iVar16,iVar42,BVar11,bVar45 + 1 + (uint)bVar45);
      bVar45 = part_search_state.terminate_partition_search != 0;
    }
    else {
LAB_001cf711:
      iVar33 = 0x7fffffffffffffff;
    }
    BVar11 = part_search_state.part_blk_params.bsize;
    iVar18 = part_search_state.part_blk_params.mi_col;
    iVar42 = part_search_state.part_blk_params.mi_row;
    iVar16 = part_search_state.part_blk_params.mi_step;
    uVar37 = 0x7fffffffffffffff;
    auStack_290._9_7_ = part_search_state.sum_rdc._33_7_;
    auStack_290[8] = part_search_state.sum_rdc.skip_txfm;
    var_max._4_4_ = part_search_state.sum_rdc.zero_rate;
    var_max._0_4_ = part_search_state.sum_rdc.rate;
    local_298 = part_search_state.sum_rdc.rdcost;
    auStack_290._0_8_ = part_search_state.sum_rdc.sse;
    uStack_2a0 = part_search_state.sum_rdc.dist;
    local_314 = (uint)part_search_state.part_blk_params.bsize;
    uVar49 = 0x75;
    uVar50 = 0x1cfc;
    BVar12 = get_partition_subsize(part_search_state.part_blk_params.bsize,'\x03');
    if (!bVar45) {
      uVar37 = 0x7fffffffffffffff;
      if (part_search_state.do_square_split != 0) {
        uVar49 = 2;
        uVar50 = 0;
        cpi = pAVar51;
        uVar43 = best_rdc.rdcost;
        for (lVar19 = 0; best_rdc.rdcost = uVar43, lVar19 != 4; lVar19 = lVar19 + 1) {
          pPVar20 = pc_tree->split[lVar19];
          if (pPVar20 == (PC_TREE *)0x0) {
            uVar49 = 0xd9;
            uVar50 = 0x1cfc;
            pPVar20 = av1_alloc_pc_tree_node(BVar12);
            pc_tree->split[lVar19] = pPVar20;
            uVar43 = best_rdc.rdcost;
            if (pPVar20 == (PC_TREE *)0x0) {
              uVar49 = 2;
              uVar50 = 0x1cfd;
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
              pPVar20 = pc_tree->split[lVar19];
              uVar43 = best_rdc.rdcost;
            }
          }
          pPVar20->index = (int)lVar19;
        }
        local_340 = iVar33;
        auStack_290._0_9_ = (unkuint9)1 << 0x40;
        _var_max = ZEXT416((uint)part_search_state.partition_cost[3]);
        uVar37 = (ulong)(td->mb).rdmult;
        local_298 = (long)(uVar37 * (long)part_search_state.partition_cost[3] + 0x100) >> 9;
        none_rd_00 = part_search_state.split_rd;
        local_328 = uVar43;
        for (uVar34 = 0; uVar34 != 4; uVar34 = uVar34 + 1) {
          if ((long)uVar43 <= (long)local_298) {
LAB_001d00db:
            bVar45 = uVar34 < 3;
            goto LAB_001d00e2;
          }
          iVar35 = ((uint)(uVar34 >> 1) & 0x7fffffff) * iVar16 + iVar42;
          if (iVar35 < (cpi->common).mi_params.mi_rows) {
            iVar29 = 0;
            if ((uVar34 & 1) != 0) {
              iVar29 = iVar16;
            }
            iVar29 = iVar29 + iVar18;
            if (iVar29 < (cpi->common).mi_params.mi_cols) {
              pPVar20 = pc_tree->split[uVar34];
              pPVar20->index = (int)uVar34;
              av1_rd_stats_subtraction
                        ((int)uVar37,&best_rdc,(RD_STATS *)&var_max,(RD_STATS *)&var_max_1);
              iVar26 = 0;
              if ((BVar11 < BLOCK_64X128) &&
                 (iVar26 = 0, ((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
                iVar26 = (part_search_state.intra_part_info)->quad_tree_idx;
                (part_search_state.intra_part_info)->quad_tree_idx = (int)uVar34 + iVar26 * 4 + 1;
              }
              if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
                sms_tree_00 = (SIMPLE_MOTION_DATA_TREE *)0x0;
              }
              else {
                sms_tree_00 = sms_tree->split[uVar34];
              }
              pRVar30 = (RD_RECT_PART_WIN_INFO *)((long)none_rd_00 + -0x94);
              uVar49 = SUB81(pRVar30,0);
              uVar50 = (undefined7)((ulong)pRVar30 >> 8);
              best_rdc_00.dist._0_4_ = (int)appPStack_2e0[0];
              best_rdc_00._0_8_ = var_max_1;
              best_rdc_00.dist._4_4_ = (int)((ulong)appPStack_2e0[0] >> 0x20);
              best_rdc_00.rdcost._0_4_ = (int)appPStack_2e0[1];
              best_rdc_00.rdcost._4_4_ = (int)((ulong)appPStack_2e0[1] >> 0x20);
              best_rdc_00.sse._0_4_ = (int)appPStack_2e0[2];
              best_rdc_00.sse._4_4_ = (int)((ulong)appPStack_2e0[2] >> 0x20);
              best_rdc_00._32_4_ = (int)appPStack_2e0[3];
              best_rdc_00._36_4_ = (int)((ulong)appPStack_2e0[3] >> 0x20);
              _Var14 = av1_rd_pick_partition
                                 (cpi,td,tile_data,tp,iVar35,iVar29,BVar12,
                                  &part_search_state.this_rdc,best_rdc_00,pPVar20,sms_tree_00,
                                  none_rd_00,multi_pass_mode,pRVar30);
              auVar48 = _var_max;
              if (!_Var14) {
                var_max._0_4_ = 0x7fffffff;
                uStack_2a0 = 0x7fffffffffffffff;
                local_298 = 0x7fffffffffffffff;
                auStack_290._0_9_ = ZEXT89(0x7fffffffffffffff);
                goto LAB_001d00db;
              }
              if ((BVar11 < BLOCK_64X128) && (((cpi->common).current_frame.frame_type & 0xfd) == 0))
              {
                (part_search_state.intra_part_info)->quad_tree_idx = iVar26;
              }
              var_max._0_4_ = var_max._0_4_ + part_search_state.this_rdc.rate;
              auVar8 = _var_max;
              uStack_2a0 = auVar48._8_8_;
              var_max = auVar8._0_8_;
              uStack_2a0 = uStack_2a0 + part_search_state.this_rdc.dist;
              uVar25 = (td->mb).rdmult;
              uVar37 = (ulong)uVar25;
              uVar49 = 0x8f;
              uVar50 = 0x1cff;
              av1_rd_cost_update(uVar25,(RD_STATS *)&var_max);
              uVar43 = local_328;
              if (((uVar34 < 2) &&
                  (((BVar11 < BLOCK_8X16 || (pc_tree->split[uVar34]->partitioning == '\0')) &&
                   (pPVar21 = pc_tree->split[uVar34]->none,
                   (pPVar21->mic).palette_mode_info.palette_size[0] == '\0')))) &&
                 (((pPVar21->mic).palette_mode_info.palette_size[1] == '\0' &&
                  ((pPVar21->mic).uv_mode != '\r')))) {
                part_search_state.is_split_ctx_is_ready[uVar34] = 1;
              }
            }
          }
          none_rd_00 = none_rd_00 + 1;
        }
        bVar45 = false;
        if ((long)local_298 < (long)uVar43) {
          uVar34 = uStack_2a0 * 0x80 + ((long)(int)uVar37 * (long)var_max._0_4_ + 0x100 >> 9);
          uVar37 = local_298;
          if ((long)uVar34 < (long)uVar43) {
            best_rdc._32_8_ = auStack_290._8_8_;
            best_rdc.sse._0_4_ = auStack_290._0_4_;
            best_rdc.sse._4_4_ = auStack_290._4_4_;
            best_rdc.zero_rate = var_max._4_4_;
            best_rdc.dist = uStack_2a0;
            part_search_state.found_best_partition = true;
            pc_tree->partitioning = '\x03';
            best_rdc.rate = var_max._0_4_;
            best_rdc.rdcost = uVar34;
          }
        }
        else {
LAB_001d00e2:
          iVar16 = (cpi->sf).part_sf.less_rectangular_check_level;
          uVar37 = local_298;
          uVar34 = local_298;
          if ((0 < iVar16) && (bVar45 || iVar16 == 2)) {
            uVar25 = part_search_state.do_rectangular_split & 1;
            if (0 < part_search_state.none_rd) {
              uVar25 = (uint)((long)local_298 <= part_search_state.none_rd) &
                       part_search_state.do_rectangular_split;
            }
            part_search_state.do_rectangular_split = uVar25;
          }
        }
        local_298 = uVar34;
        iVar33 = local_340;
        pSVar3 = (cpi->common).seq_params;
        pAVar51 = cpi;
        if ((BVar11 <= (td->mb).sb_enc.max_partition_size) || (BVar11 == pSVar3->sb_size)) {
          bVar45 = pSVar3->monochrome == '\0';
          uVar49 = 0x76;
          uVar50 = 0x1d01;
          av1_restore_context(&td->mb,&x_ctx,iVar42,iVar18,(BLOCK_SIZE)local_314,
                              bVar45 + 1 + (uint)bVar45);
        }
      }
    }
    BVar11 = part_search_state.part_blk_params.bsize;
    iVar42 = part_search_state.part_blk_params.mi_col;
    iVar16 = part_search_state.part_blk_params.mi_row;
    if (((((cpi->sf).part_sf.early_term_after_none_split != 0) && (iVar33 == 0x7fffffffffffffff)) &&
        (uVar37 == 0x7fffffffffffffff)) &&
       (((td->mb).must_find_valid_partition == 0 && (((cpi->common).seq_params)->sb_size != bsize)))
       ) {
      part_search_state.terminate_partition_search = 1;
    }
    if ((((1 < (cpi->sf).part_sf.skip_non_sq_part_based_on_none) &&
         (pPVar21 = pc_tree->none, pPVar21 != (PICK_MODE_CONTEXT *)0x0)) &&
        (((td->mb).qindex < 0xc9 && (bVar41 = (pPVar21->mic).mode, 0xf3 < (byte)(bVar41 - 0x19)))))
       && ((((0x18 < bVar41 || ((0x1790000U >> (bVar41 & 0x1f) & 1) == 0)) &&
            (pPVar21->skippable != 0)) &&
           ((BLOCK_16X8 < bsize && ((td->mb).must_find_valid_partition == 0)))))) {
      part_search_state._296_8_ = part_search_state._296_8_ & 0xffffffff00000000;
    }
    pAVar52 = pAVar51;
    if ((pAVar51->sf).part_sf.ml_early_term_after_part_split_level == 0) {
LAB_001d02bd:
      pAVar40 = pAVar52;
      if (((((pAVar52->sf).part_sf.ml_prune_partition != 0) &&
           (((pAVar52->common).current_frame.frame_type & 0xfd) != 0)) &&
          (part_search_state.partition_rect_allowed[1] != 0 ||
           part_search_state.partition_rect_allowed[0] != 0)) &&
         (((part_search_state.prune_rect_part[0] == 0 && (part_search_state.prune_rect_part[1] == 0)
           ) && (part_search_state.terminate_partition_search == 0)))) {
        bVar45 = ((pAVar52->common).seq_params)->monochrome == '\0';
        av1_setup_src_planes(&td->mb,pAVar52->source,iVar16,iVar42,bVar45 + 1 + (uint)bVar45,BVar11)
        ;
        uVar49 = 0x6e;
        uVar50 = 0x1d03;
        av1_ml_prune_rect_partition
                  (pAVar52,&td->mb,best_rdc.rdcost,part_search_state.none_rd,
                   part_search_state.split_rd,&part_search_state);
      }
    }
    else {
      pAVar40 = pAVar51;
      if (((((pAVar51->common).current_frame.frame_type & 0xfd) != 0) &&
          (part_search_state.terminate_partition_search == 0)) &&
         ((part_search_state.do_rectangular_split != 0 &&
          (part_search_state.partition_rect_allowed[1] != 0 ||
           part_search_state.partition_rect_allowed[0] != 0)))) {
        uVar49 = SUB81(&part_search_state,0);
        uVar50 = (undefined7)((ulong)&part_search_state >> 8);
        av1_ml_early_term_after_split
                  (pAVar51,&td->mb,sms_tree,best_rdc.rdcost,iVar33,uVar37,part_search_state.split_rd
                   ,&part_search_state);
        pAVar40 = pAVar52;
        if ((pAVar51->sf).part_sf.ml_early_term_after_part_split_level == 0) goto LAB_001d02bd;
      }
    }
    BVar11 = part_search_state.part_blk_params.bsize;
    iVar42 = part_search_state.part_blk_params.mi_col;
    iVar16 = part_search_state.part_blk_params.mi_row;
    var_max = (double)CONCAT44(part_search_state.part_blk_params.mi_col,
                               part_search_state.part_blk_params.mi_row);
    uStack_2a0._0_4_ = part_search_state.part_blk_params.mi_row_edge;
    uStack_2a0._4_4_ = part_search_state.part_blk_params.mi_col;
    local_298 = CONCAT44(part_search_state.part_blk_params.mi_col,
                         part_search_state.part_blk_params.mi_row);
    auStack_290._4_4_ = part_search_state.part_blk_params.mi_col_edge;
    auStack_290._0_4_ = part_search_state.part_blk_params.mi_row;
    local_310._0_8_ =
         CONCAT44(part_search_state.part_blk_params.has_cols,
                  part_search_state.part_blk_params.has_rows);
    pdVar39 = &var_max_1;
    var_max_1 = (double)local_330;
    appPStack_2e0[0] = local_230;
    appPStack_2e0[1] = local_338;
    appPStack_2e0[2] = local_238;
    for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
      if (((part_search_state.terminate_partition_search == 0) &&
          (part_search_state.partition_rect_allowed[lVar19] != 0)) &&
         (part_search_state.prune_rect_part[lVar19] == 0)) {
        pAVar51 = pAVar40;
        if (part_search_state.do_rectangular_split == 0) {
          uVar49 = 0x8d;
          uVar50 = 0x1d04;
          iVar18 = (*(code *)(&PTR_av1_active_h_edge_0054c910)[lVar19])
                             (pAVar40,*(int *)((long)(&var_max + lVar19 * 2) + lVar19 * 4),
                              part_search_state.part_blk_params.mi_step);
          pAVar51 = pAVar40;
          if (iVar18 == 0) goto LAB_001d0430;
        }
        local_328 = (ulong)(uint)(&DAT_0043e6d0)[lVar19];
        bVar41 = (byte)(&DAT_0043e6d0)[lVar19];
        BVar12 = get_partition_subsize(BVar11,bVar41);
        part_search_state.sum_rdc.rate = 0;
        part_search_state.sum_rdc.dist = 0;
        part_search_state.sum_rdc.rdcost = 0;
        part_search_state.sum_rdc.sse = 0;
        part_search_state.sum_rdc.skip_txfm = '\x01';
        part_search_state.sum_rdc.zero_rate = 0;
        for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
          plVar5 = (long *)pdVar39[lVar27];
          if (*plVar5 == 0) {
            pPVar21 = av1_alloc_pmc(pAVar51,BVar12,shared_bufs);
            *plVar5 = (long)pPVar21;
            if (pPVar21 == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
            }
          }
        }
        part_search_state.sum_rdc.rate = part_search_state.partition_cost[bVar41];
        part_search_state.sum_rdc.rdcost =
             (long)(td->mb).rdmult * (long)part_search_state.partition_cost[bVar41] + 0x100 >> 9;
        ppPVar22 = appPStack_2e0[lVar19 * 2 + -1];
        rd_pick_rect_partition
                  (pAVar51,tile_data,&td->mb,*ppPVar22,&part_search_state,&best_rdc,0,
                   *(int *)(&var_max + lVar19 * 2),*(int *)((long)&var_max + lVar19 * 0x10 + 4),
                   BVar12,bVar41);
        iVar33 = best_rdc.rdcost;
        pAVar40 = pAVar51;
        if ((part_search_state.sum_rdc.rdcost < best_rdc.rdcost) &&
           (*(int *)(local_310 + lVar19 * 4) != 0)) {
          pPVar21 = *ppPVar22;
          if (((pPVar21->mic).palette_mode_info.palette_size[0] == '\0') &&
             (((pPVar21->mic).palette_mode_info.palette_size[1] == '\0' &&
              ((pPVar21->mic).uv_mode != '\r')))) {
            part_search_state.is_rect_ctx_is_ready[lVar19] = 1;
          }
          av1_update_state(pAVar51,td,pPVar21,iVar16,iVar42,BVar12,'\x01');
          encode_superblock(pAVar51,tile_data,td,tp,'\x01',BVar12,(int *)pAVar40);
          rd_pick_rect_partition
                    (pAVar51,tile_data,&td->mb,*appPStack_2e0[lVar19 * 2],&part_search_state,
                     &best_rdc,1,*(int *)(&uStack_2a0 + lVar19 * 2),
                     *(int *)((long)&uStack_2a0 + lVar19 * 0x10 + 4),BVar12,bVar41);
        }
        if (part_search_state.sum_rdc.rdcost < iVar33) {
          part_search_state.sum_rdc.rdcost =
               part_search_state.sum_rdc.dist * 0x80 +
               ((long)(td->mb).rdmult * (long)part_search_state.sum_rdc.rate + 0x100 >> 9);
          if (part_search_state.sum_rdc.rdcost < iVar33) {
            best_rdc._33_7_ = part_search_state.sum_rdc._33_7_;
            best_rdc.skip_txfm = part_search_state.sum_rdc.skip_txfm;
            best_rdc.sse._0_4_ = (undefined4)part_search_state.sum_rdc.sse;
            best_rdc.sse._4_4_ = part_search_state.sum_rdc.sse._4_4_;
            best_rdc.rate = part_search_state.sum_rdc.rate;
            best_rdc.zero_rate = part_search_state.sum_rdc.zero_rate;
            best_rdc.dist = part_search_state.sum_rdc.dist;
            part_search_state.found_best_partition = true;
            pc_tree->partitioning = (PARTITION_TYPE)local_328;
            best_rdc.rdcost = part_search_state.sum_rdc.rdcost;
          }
        }
        else if (rect_part_win_info != (RD_RECT_PART_WIN_INFO *)0x0) {
          rect_part_win_info->rect_part_win[lVar19] = 0;
        }
        bVar45 = ((pAVar40->common).seq_params)->monochrome == '\0';
        uVar49 = 0xae;
        uVar50 = 0x1d07;
        av1_restore_context(&td->mb,&x_ctx,iVar16,iVar42,BVar11,bVar45 + 1 + (uint)bVar45);
      }
LAB_001d0430:
      pdVar39 = pdVar39 + 2;
    }
    pAVar51 = pAVar40;
    uVar37 = best_rdc.rdcost;
    if (local_4b0 == 0xffffffff) {
      av1_setup_src_planes(&td->mb,pAVar40->source,mi_row,mi_col,num_planes,bsize);
      uVar49 = 7;
      uVar50 = 0x1d08;
      local_4b0 = av1_get_perpixel_variance_facade(pAVar40,local_320,local_1e0,bsize,0);
      uVar37 = best_rdc.rdcost;
    }
    BVar12 = part_search_state.part_blk_params.split_bsize2;
    BVar11 = part_search_state.part_blk_params.bsize;
    iVar29 = part_search_state.part_blk_params.mi_col_edge;
    iVar35 = part_search_state.part_blk_params.mi_row_edge;
    iVar18 = part_search_state.part_blk_params.mi_col;
    iVar42 = part_search_state.part_blk_params.mi_row;
    iVar16 = (td->mb).must_find_valid_partition;
    if ((((pc_tree->none == (PICK_MODE_CONTEXT *)0x0) ||
         ((pAVar40->sf).part_sf.skip_non_sq_part_based_on_none < 1)) || (bsize < BLOCK_16X16)) ||
       (iVar16 != 0)) {
LAB_001d0841:
      bVar15 = 1;
      bVar41 = 0;
    }
    else {
      bVar15 = 0;
      bVar41 = 1;
      if (pc_tree->none->skippable == 0) goto LAB_001d0841;
    }
    _Var14 = true;
    if (uVar37 != 0x7fffffffffffffff) {
      uVar49 = 0xf;
      uVar50 = 0;
      BVar31 = (BLOCK_SIZE)*(undefined4 *)&(pAVar40->sf).part_sf.ext_partition_eval_thresh;
      BVar32 = BLOCK_128X128;
      if ((pAVar40->sf).part_sf.ext_part_eval_based_on_cur_best == 0) {
        BVar32 = BVar31;
      }
      if (iVar16 != 0) {
        BVar32 = BVar31;
      }
      if ((byte)(pc_tree->partitioning - 1) < 2) {
        BVar32 = BVar31;
      }
      _Var14 = (_Bool)((part_search_state.part_blk_params.has_cols != 0 &&
                       (part_search_state.part_blk_params.has_rows != 0 &&
                       part_search_state.do_rectangular_split != 0)) & bVar15 &
                      BVar32 < part_search_state.part_blk_params.bsize);
    }
    if (part_search_state.terminate_partition_search == 0) {
      uVar7 = CONCAT44(part_search_state.part_blk_params.mi_col_edge,
                       part_search_state.part_blk_params.mi_row_edge);
      best_rdc.rdcost = uVar37;
      av1_prune_ab_partitions
                (pAVar40,&td->mb,pc_tree,local_4b0,uVar37,rect_part_win_info,_Var14,
                 &part_search_state,ab_partitions_allowed);
      local_228 = part_search_state.is_split_ctx_is_ready[0];
      local_224 = CONCAT44(part_search_state.is_rect_ctx_is_ready[0],
                           part_search_state.is_split_ctx_is_ready[1]);
      local_21c = 0;
      local_218 = part_search_state.is_split_ctx_is_ready[0];
      local_214 = 0;
      local_210 = part_search_state.is_rect_ctx_is_ready[1];
      local_20c = 0;
      cur_part_ctxs[0] = local_1e8;
      cur_part_ctxs[1] = local_1f0;
      cur_part_ctxs[2] = local_1f8;
      cur_part_ctxs[3] = local_200;
      appPStack_2e0[1] = local_330;
      local_2b8 = local_338;
      if (part_search_state.is_split_ctx_is_ready[0] != 0) {
        var_max_1 = (double)&pc_tree->split[0]->none;
        appPStack_2e0[3] = (PICK_MODE_CONTEXT **)var_max_1;
      }
      if (part_search_state.is_split_ctx_is_ready[1] != 0) {
        appPStack_2e0[0] = &pc_tree->split[1]->none;
      }
      pBVar38 = &local_18c;
      local_18c = BVar12;
      local_18b = BVar12;
      local_18a = get_partition_subsize(BVar11,'\x04');
      local_189 = get_partition_subsize(BVar11,'\x05');
      auVar48 = pshuflw(ZEXT216(CONCAT11(BVar12,BVar12)),ZEXT216(CONCAT11(BVar12,BVar12)),0);
      local_188 = auVar48._0_4_;
      local_184 = get_partition_subsize(BVar11,'\x06');
      uVar49 = 0x77;
      uVar50 = 0x1d0a;
      pAVar40 = pAVar51;
      local_183 = get_partition_subsize(BVar11,'\a');
      local_182 = BVar12;
      local_181 = BVar12;
      auVar48._8_8_ = uVar7;
      auVar48._0_8_ = CONCAT44(iVar18,iVar42);
      uStack_2a0._0_4_ = iVar42;
      var_max = (double)CONCAT44(iVar18,iVar42);
      uStack_2a0._4_4_ = iVar29;
      local_530 = (long)&var_max + 4;
      local_298 = CONCAT44(iVar18,iVar35);
      auStack_290._0_12_ = auVar48._0_12_;
      auStack_290._12_4_ = iVar18;
      local_280._8_4_ = iVar42;
      local_280._0_8_ = uVar7;
      local_280._12_4_ = iVar18;
      local_270 = iVar35;
      iStack_26c = iVar18;
      iStack_268 = iVar42;
      iStack_264 = iVar29;
      local_260 = _var_max;
      local_250 = uVar7;
      pAVar51 = pAVar40;
      uVar37 = best_rdc.rdcost;
      for (uVar43 = 0; uVar43 != 4; uVar43 = uVar43 + 1) {
        if (ab_partitions_allowed[uVar43] == 0) goto LAB_001d1053;
        local_518 = (undefined4)(uVar43 | 4);
        uStack_514 = (undefined4)(uVar43 >> 0x20);
        for (lVar19 = 0; best_rdc.rdcost = uVar37, lVar19 != 3; lVar19 = lVar19 + 1) {
          pPVar21 = av1_alloc_pmc(pAVar40,pBVar38[lVar19],shared_bufs);
          ppPVar22 = cur_part_ctxs[uVar43];
          ppPVar22[lVar19] = pPVar21;
          uVar37 = best_rdc.rdcost;
          if (pPVar21 == (PICK_MODE_CONTEXT *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
            pPVar21 = ppPVar22[lVar19];
            uVar37 = best_rdc.rdcost;
          }
          pPVar21->rd_mode_is_ready = 0;
        }
        partition = (PARTITION_TYPE)(uVar43 | 4);
        if (((pAVar40->sf).part_sf.reuse_prev_rd_results_for_part_ab != 0) &&
           ((&local_228)[uVar43 * 2] != 0)) {
          ppPVar22 = cur_part_ctxs[uVar43];
          av1_copy_tree_context(*ppPVar22,*appPStack_2e0[uVar43 * 2 + -1]);
          pPVar21 = *ppPVar22;
          (pPVar21->mic).partition = partition;
          pPVar21->rd_mode_is_ready = 1;
          if (*(int *)(&local_224 + uVar43) != 0) {
            av1_copy_tree_context(ppPVar22[1],*appPStack_2e0[uVar43 * 2]);
            pPVar21 = ppPVar22[1];
            (pPVar21->mic).partition = partition;
            pPVar21->rd_mode_is_ready = 1;
          }
        }
        BVar11 = part_search_state.part_blk_params.bsize;
        iVar42 = part_search_state.part_blk_params.mi_col;
        iVar16 = part_search_state.part_blk_params.mi_row;
        local_348 = (PICK_MODE_CONTEXT *)0x0;
        local_358 = (undefined1  [16])0x0;
        if ((pAVar40->sf).part_sf.reuse_best_prediction_for_part_ab == 0)
        goto switchD_001d0c32_default;
        switch(uVar43 & 0xff) {
        case 0:
          if (((pc_tree->split[0] == (PC_TREE *)0x0) ||
              (local_358._0_8_ = pc_tree->split[0]->none,
              (PICK_MODE_CONTEXT *)local_358._0_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
             ((((PICK_MODE_CONTEXT *)local_358._0_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._0_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          if (((pc_tree->split[1] == (PC_TREE *)0x0) ||
              (local_358._8_8_ = pc_tree->split[1]->none,
              (PICK_MODE_CONTEXT *)local_358._8_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
             ((((PICK_MODE_CONTEXT *)local_358._8_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._8_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          ppPVar22 = local_230;
          break;
        case 1:
          local_358._0_8_ = *local_330;
          if (((PICK_MODE_CONTEXT *)local_358._0_8_ == (PICK_MODE_CONTEXT *)0x0) ||
             ((((PICK_MODE_CONTEXT *)local_358._0_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._0_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          pPVar20 = pc_tree->split[2];
          goto LAB_001d0d86;
        case 2:
          if (((pc_tree->split[0] == (PC_TREE *)0x0) ||
              (local_358._0_8_ = pc_tree->split[0]->none,
              (PICK_MODE_CONTEXT *)local_358._0_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
             ((((PICK_MODE_CONTEXT *)local_358._0_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._0_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          if (((pc_tree->split[2] == (PC_TREE *)0x0) ||
              (local_358._8_8_ = pc_tree->split[2]->none,
              (PICK_MODE_CONTEXT *)local_358._8_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
             ((((PICK_MODE_CONTEXT *)local_358._8_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._8_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          ppPVar22 = local_238;
          break;
        case 3:
          local_358._0_8_ = *local_338;
          if (((PICK_MODE_CONTEXT *)local_358._0_8_ == (PICK_MODE_CONTEXT *)0x0) ||
             ((((PICK_MODE_CONTEXT *)local_358._0_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._0_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          pPVar20 = pc_tree->split[1];
LAB_001d0d86:
          if (((pPVar20 == (PC_TREE *)0x0) ||
              (local_358._8_8_ = pPVar20->none,
              (PICK_MODE_CONTEXT *)local_358._8_8_ == (PICK_MODE_CONTEXT *)0x0)) ||
             ((((PICK_MODE_CONTEXT *)local_358._8_8_)->rd_stats).rate == 0x7fffffff)) {
            local_358._8_8_ = (PICK_MODE_CONTEXT *)0x0;
          }
          if (pc_tree->split[3] != (PC_TREE *)0x0) {
            local_348 = pc_tree->split[3]->none;
            goto LAB_001d0dc2;
          }
          goto LAB_001d0dd3;
        default:
          goto switchD_001d0c32_default;
        }
        local_348 = *ppPVar22;
LAB_001d0dc2:
        if ((local_348 == (PICK_MODE_CONTEXT *)0x0) || ((local_348->rd_stats).rate == 0x7fffffff)) {
LAB_001d0dd3:
          local_348 = (PICK_MODE_CONTEXT *)0x0;
        }
switchD_001d0c32_default:
        ppPVar22 = cur_part_ctxs[uVar43];
        iVar18 = partition_plane_context
                           (local_320,part_search_state.part_blk_params.mi_row,
                            part_search_state.part_blk_params.mi_col,
                            part_search_state.part_blk_params.bsize);
        local_2f8 = 0;
        local_2f0 = '\x01';
        local_310._0_4_ = local_1d0->partition_cost[iVar18][CONCAT44(uStack_514,local_518)];
        local_310._4_4_ = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (long)(td->mb).rdmult * (long)(int)local_310._0_4_ + 0x100 >> 9;
        stack0xfffffffffffffcf8 = auVar8 << 0x40;
        lVar19 = 0;
        pAVar52 = pAVar51;
        iVar33 = best_rdc.rdcost;
        do {
          pAVar51 = pAVar52;
          best_rdc.rdcost._4_4_ = (int)((ulong)iVar33 >> 0x20);
          best_rdc.rdcost._0_4_ = (undefined4)iVar33;
          best_rdc.rdcost = iVar33;
          if (lVar19 == 3) {
            iVar18 = (td->mb).rdmult;
            av1_rd_cost_update(iVar18,(RD_STATS *)local_310);
            if (lStack_300 < best_rdc.rdcost) {
              lStack_300 = local_310._8_8_ * 0x80 +
                           ((long)(int)local_310._0_4_ * (long)iVar18 + 0x100 >> 9);
              if (lStack_300 < best_rdc.rdcost) {
                best_rdc._33_7_ = uStack_2ef;
                best_rdc.skip_txfm = local_2f0;
                best_rdc.sse._0_4_ = (undefined4)local_2f8;
                best_rdc.sse._4_4_ = (undefined4)((ulong)local_2f8 >> 0x20);
                best_rdc.zero_rate = SUB84(local_310._0_8_,4);
                best_rdc.dist = local_310._8_8_;
                pc_tree->partitioning = partition;
                bVar15 = 1;
                best_rdc.rate = local_310._0_4_;
                best_rdc.rdcost = lStack_300;
                goto LAB_001d1017;
              }
            }
            bVar15 = 0;
            goto LAB_001d1017;
          }
          pMVar6 = *(MB_MODE_INFO **)(local_358 + lVar19 * 8);
          if (pMVar6 != (MB_MODE_INFO *)0x0) {
            (td->mb).use_mb_mode_cache = 1;
            (td->mb).mb_mode_cache = pMVar6;
          }
          best_rdcost.zero_rate = best_rdc.zero_rate;
          best_rdcost.rate = best_rdc.rate;
          best_rdcost.dist._0_4_ = (int)best_rdc.dist;
          best_rdcost.dist._4_4_ = (int)((ulong)best_rdc.dist >> 0x20);
          best_rdcost.rdcost._0_4_ = (undefined4)best_rdc.rdcost;
          best_rdcost.rdcost._4_4_ = best_rdc.rdcost._4_4_;
          best_rdcost.sse._0_4_ = (undefined4)best_rdc.sse;
          best_rdcost.sse._4_4_ = best_rdc.sse._4_4_;
          best_rdcost._32_4_ = best_rdc._32_4_;
          best_rdcost._36_4_ = best_rdc._36_4_;
          pAVar52 = pAVar51;
          iVar18 = rd_try_subblock(pAVar51,td,tile_data,tp,(uint)(lVar19 == 2),
                                   *(int *)(local_530 + -4 + lVar19 * 8),
                                   *(int *)(local_530 + lVar19 * 8),pBVar38[lVar19],best_rdcost,
                                   (RD_STATS *)local_310,partition,ppPVar22[lVar19]);
          (td->mb).use_mb_mode_cache = 0;
          (td->mb).mb_mode_cache = (MB_MODE_INFO *)0x0;
          lVar19 = lVar19 + 1;
          pAVar40 = pAVar51;
          iVar33 = best_rdc.rdcost;
        } while (iVar18 != 0);
        bVar15 = 0;
        pAVar51 = pAVar52;
LAB_001d1017:
        part_search_state.found_best_partition =
             (_Bool)(part_search_state.found_best_partition | bVar15);
        bVar45 = ((pAVar40->common).seq_params)->monochrome == '\0';
        uVar49 = 0x53;
        uVar50 = 0x1d10;
        av1_restore_context(&td->mb,&x_ctx,iVar16,iVar42,BVar11,bVar45 + 1 + (uint)bVar45);
        uVar37 = best_rdc.rdcost;
LAB_001d1053:
        pBVar38 = pBVar38 + 3;
        local_530 = local_530 + 0x18;
      }
    }
    BVar11 = part_search_state.part_blk_params.bsize;
    part4_search_allowed[0] = 1;
    part4_search_allowed[1] = 1;
    bVar45 = true;
    if (uVar37 == 0x7fffffffffffffff) {
LAB_001d1312:
      best_rdc.rdcost = uVar37;
      if ((part_search_state.terminate_partition_search == 0) && (bVar45)) {
        var_max = (double)CONCAT71(0,"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                     [uVar36] >> 2);
        uVar49 = 8;
        uVar50 = 0;
        rd_pick_4partition(pAVar40,td,tile_data,tp,&td->mb,&x_ctx,pc_tree,local_208,
                           &part_search_state,&best_rdc,(int *)&var_max,'\b');
      }
    }
    else {
      BVar12 = (pAVar40->sf).part_sf.ext_partition_eval_thresh;
      if (((pAVar40->sf).part_sf.ext_part_eval_based_on_cur_best != 0) &&
         ((td->mb).must_find_valid_partition == 0)) {
        uVar49 = 0xf;
        uVar50 = 0;
        if (pc_tree->partitioning == '\0') {
          BVar12 = BLOCK_128X128;
        }
      }
      bVar45 = true;
      if (((part_search_state.do_rectangular_split != 0) &&
          (BVar12 < part_search_state.part_blk_params.bsize)) &&
         (part_search_state.part_blk_params.has_rows != 0)) {
        bVar45 = (bool)(bVar41 | part_search_state.part_blk_params.has_cols == 0);
      }
      pAVar40 = pAVar51;
      best_rdc.rdcost = uVar37;
      if (part_search_state.part_blk_params.min_partition_size_1d <<
          ((byte)(pAVar51->sf).part_sf.prune_part4_search & 0x1f) <=
          part_search_state.part_blk_params.width) {
        bVar46 = part_search_state.part_blk_params.bsize != BLOCK_128X128;
        bVar41 = (pAVar51->oxcf).part_cfg.enable_1to4_partitions ^ 1;
        lVar19 = (long)part_search_state.ss_x;
        lVar44 = (long)part_search_state.ss_y;
        for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
          uVar25 = 0;
          if (((!bVar45 && bVar41 == 0) && bVar46) &&
             (uVar25 = 0, part_search_state.partition_rect_allowed[lVar27] != 0)) {
            BVar12 = get_partition_subsize(BVar11,(&DAT_0043e6a6)[lVar27]);
            uVar25 = (uint)(av1_ss_size_lookup[BVar12][lVar19][lVar44] != BLOCK_INVALID);
          }
          part4_search_allowed[lVar27] = uVar25;
        }
        uVar49 = 3;
        iVar16 = 3;
        if ((pAVar40->sf).part_sf.prune_ext_partition_types_search_level == 2) {
          bVar15 = pc_tree->partitioning;
          uVar25 = bVar15 - 1;
          if ((byte)uVar25 < 5) {
            uVar17 = 1;
            uVar49 = 0x1d;
            if ((0x1dU >> (uVar25 & 0x1f) & 1) == 0) goto LAB_001d11f9;
          }
          else {
LAB_001d11f9:
            uVar17 = (uint)(bVar15 == 0);
          }
          uVar25 = bVar15 - 2;
          if ((byte)uVar25 < 6) {
            uVar49 = 1;
            uVar24 = 1;
            if ((0x33U >> (uVar25 & 0x1f) & 1) == 0) goto LAB_001d121a;
          }
          else {
LAB_001d121a:
            uVar24 = (uint)(bVar15 == 0);
          }
          part4_search_allowed[1] = part4_search_allowed[1] & uVar24;
          part4_search_allowed[0] = part4_search_allowed[0] & uVar17;
        }
        uVar50 = 0;
        pAVar51 = pAVar40;
        if ((((pAVar40->sf).part_sf.ml_prune_partition != 0 &&
              ((!bVar45 && (bVar41 & 1) == 0) && bVar46)) &&
            (part_search_state.partition_rect_allowed[0] != 0)) &&
           (part_search_state.partition_rect_allowed[1] != 0)) {
          av1_ml_prune_4_partition
                    (pAVar40,&td->mb,(uint)pc_tree->partitioning,uVar37,&part_search_state,
                     part4_search_allowed,local_4b0);
        }
        uVar37 = best_rdc.rdcost;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uStack_2a0;
        _var_max = auVar9 << 0x40;
        iVar42 = (td->mb).qindex;
        if (0x55 < iVar42) {
          uVar49 = 0x55;
          uVar50 = 0;
          iVar16 = (0xff - iVar42) / 0x55 + 1;
        }
        iVar42 = (pAVar40->sf).part_sf.prune_ext_part_using_split_info;
        pRVar30 = part_search_state.split_part_rect_win;
        for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
          if ((iVar42 != 0) && (bVar41 = (&DAT_0043e6a8)[lVar19], part4_search_allowed[bVar41] != 0)
             ) {
            iVar18 = *(int *)((long)&var_max + lVar19 * 4);
            for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
              iVar18 = (iVar18 + 1) - (uint)(pRVar30[lVar27].rect_part_win[0] == 0);
            }
            *(int *)((long)&var_max + lVar19 * 4) = iVar18;
            if (iVar18 < iVar16) {
              part4_search_allowed[bVar41] = 0;
            }
          }
          pRVar30 = (RD_RECT_PART_WIN_INFO *)(pRVar30->rect_part_win + 1);
        }
        bVar45 = part4_search_allowed[0] != 0;
        goto LAB_001d1312;
      }
      part4_search_allowed[0] = 0;
      part4_search_allowed[1] = 0;
    }
    if (((part_search_state.terminate_partition_search == 0) && (part4_search_allowed[1] != 0)) &&
       (iVar28 < iVar2)) {
      var_max = (double)((ulong)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [uVar36] >> 2) << 0x20);
      uVar49 = 9;
      uVar50 = 0;
      rd_pick_4partition(pAVar40,td,tile_data,tp,&td->mb,&x_ctx,pc_tree,local_1d8,&part_search_state
                         ,&best_rdc,(int *)&var_max,'\t');
    }
    if ((((pAVar40->common).seq_params)->sb_size != bsize) ||
       (part_search_state.found_best_partition != false)) break;
    (td->mb).must_find_valid_partition = 1;
  } while( true );
  rd_cost->skip_txfm = best_rdc.skip_txfm;
  *(undefined7 *)&rd_cost->field_0x21 = best_rdc._33_7_;
  rd_cost->rdcost = best_rdc.rdcost;
  rd_cost->sse = CONCAT44(best_rdc.sse._4_4_,(undefined4)best_rdc.sse);
  rd_cost->rate = best_rdc.rate;
  rd_cost->zero_rate = best_rdc.zero_rate;
  rd_cost->dist = best_rdc.dist;
  if (sms_tree != (SIMPLE_MOTION_DATA_TREE *)0x0) {
    sms_tree->partitioning = pc_tree->partitioning;
  }
  if (part_search_state.found_best_partition == true) {
    BVar11 = ((pAVar40->common).seq_params)->sb_size;
    if (BVar11 == bsize) {
      (td->mb).cb_offset[0] = 0;
      (td->mb).cb_offset[1] = 0;
      encode_sb(pAVar40,td,tile_data,tp,mi_row,mi_col,multi_pass_mode == '\x01',bsize,pc_tree,
                (int *)CONCAT71(uVar50,uVar49));
      av1_free_pc_tree_recursive(pc_tree,num_planes,0,0,(pAVar40->sf).part_sf.partition_search_type)
      ;
      td->pc_root = (PC_TREE *)0x0;
      goto LAB_001d1592;
    }
    BVar12 = (td->mb).sb_enc.max_partition_size;
    if (bsize <= BVar12) {
      if (pc_tree->index == 3) {
        uVar49 = 0x34;
        uVar50 = 0x1d15;
        BVar11 = get_partition_subsize(BVar11,'\x03');
        if ((BVar12 != bsize) || (BVar11 == BVar12)) goto LAB_001d1574;
      }
      encode_sb(pAVar40,td,tile_data,tp,mi_row,mi_col,'\x01',bsize,pc_tree,
                (int *)CONCAT71(uVar50,uVar49));
    }
  }
LAB_001d1574:
  av1_free_pc_tree_recursive(pc_tree,num_planes,1,1,(pAVar40->sf).part_sf.partition_search_type);
LAB_001d1592:
  (td->mb).rdmult = local_318;
  return part_search_state.found_best_partition;
}

Assistant:

bool av1_rd_pick_partition(AV1_COMP *const cpi, ThreadData *td,
                           TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                           int mi_col, BLOCK_SIZE bsize, RD_STATS *rd_cost,
                           RD_STATS best_rdc, PC_TREE *pc_tree,
                           SIMPLE_MOTION_DATA_TREE *sms_tree, int64_t *none_rd,
                           SB_MULTI_PASS_MODE multi_pass_mode,
                           RD_RECT_PART_WIN_INFO *rect_part_win_info) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  const TokenExtra *const tp_orig = *tp;
  PartitionSearchState part_search_state;

  // Initialization of state variables used in partition search.
  init_partition_search_state_params(x, cpi, &part_search_state, mi_row, mi_col,
                                     bsize);
  PartitionBlkParams blk_params = part_search_state.part_blk_params;

  set_sms_tree_partitioning(sms_tree, PARTITION_NONE);
  if (best_rdc.rdcost < 0) {
    av1_invalid_rd_stats(rd_cost);
    return part_search_state.found_best_partition;
  }
  if (bsize == cm->seq_params->sb_size) x->must_find_valid_partition = 0;

  // Override skipping rectangular partition operations for edge blocks.
  if (none_rd) *none_rd = 0;
  (void)*tp_orig;

#if CONFIG_COLLECT_PARTITION_STATS
  // Stats at the current quad tree
  PartitionTimingStats *part_timing_stats =
      &part_search_state.part_timing_stats;
  // Stats aggregated at frame level
  FramePartitionTimingStats *fr_part_timing_stats = &cpi->partition_stats;
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Override partition costs at the edges of the frame in the same
  // way as in read_partition (see decodeframe.c).
  if (!av1_blk_has_rows_and_cols(&blk_params))
    set_partition_cost_for_edge_blk(cm, &part_search_state);

  // Disable rectangular partitions for inner blocks when the current block is
  // forced to only use square partitions.
  if (bsize > cpi->sf.part_sf.use_square_partition_only_threshold) {
    part_search_state.partition_rect_allowed[HORZ] &= !blk_params.has_rows;
    part_search_state.partition_rect_allowed[VERT] &= !blk_params.has_cols;
  }

#ifndef NDEBUG
  // Nothing should rely on the default value of this array (which is just
  // leftover from encoding the previous block. Setting it to fixed pattern
  // when debugging.
  // bit 0, 1, 2 are blk_skip of each plane
  // bit 4, 5, 6 are initialization checking of each plane
  memset(x->txfm_search_info.blk_skip, 0x77,
         sizeof(x->txfm_search_info.blk_skip));
#endif  // NDEBUG

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  // Set buffers and offsets.
  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);

  if (cpi->oxcf.mode == ALLINTRA) {
    if (bsize == cm->seq_params->sb_size) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      x->intra_sb_rdmult_modifier = 128;
      if ((var_min < 2.0) && (var_max > 4.0)) {
        if ((var_max - var_min) > 8.0) {
          x->intra_sb_rdmult_modifier -= 48;
        } else {
          x->intra_sb_rdmult_modifier -= (int)((var_max - var_min) * 6);
        }
      }
    }
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  // Apply simple motion search for the entire super block with fixed block
  // size, e.g., 16x16, to collect features and write to files for the
  // external ML model.
  // TODO(chengchen): reduce motion search. This function is similar to
  // av1_get_max_min_partition_features().
  if (COLLECT_MOTION_SEARCH_FEATURE_SB && !frame_is_intra_only(cm) &&
      bsize == cm->seq_params->sb_size) {
    av1_collect_motion_search_features_sb(cpi, td, tile_data, mi_row, mi_col,
                                          bsize, /*features=*/NULL);
    collect_tpl_stats_sb(cpi, bsize, mi_row, mi_col, /*features=*/NULL);
  }

  // Update rd cost of the bound using the current multiplier.
  av1_rd_cost_update(x->rdmult, &best_rdc);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh)
    x->mb_energy = av1_log_block_var(cpi, x, bsize);

  // Set the context.
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_prune_partitions_time);
#endif
  // Pruning: before searching any partition type, using source and simple
  // motion search results to prune out unlikely partitions.
  av1_prune_partitions_before_search(cpi, x, sms_tree, &part_search_state);

  // Pruning: eliminating partition types leading to coding block sizes outside
  // the min and max bsize limitations set from the encoder.
  av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_prune_partitions_time);
#endif

  // Partition search
BEGIN_PARTITION_SEARCH:
  // If a valid partition is required, usually when the first round cannot find
  // a valid one under the cost limit after pruning, reset the limitations on
  // partition types and intra cnn output.
  if (x->must_find_valid_partition) {
    reset_part_limitations(cpi, &part_search_state);
    av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
    // Invalidate intra cnn output for key frames.
    if (frame_is_intra_only(cm) && bsize == BLOCK_64X64) {
      part_search_state.intra_part_info->quad_tree_idx = 0;
      part_search_state.intra_part_info->cnn_output_valid = 0;
    }
  }
  // Partition block source pixel variance.
  unsigned int pb_source_variance = UINT_MAX;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, none_partition_search_time);
#endif

  if (cpi->oxcf.mode == ALLINTRA) {
    const bool bsize_at_least_16x16 = (bsize >= BLOCK_16X16);
    const bool prune_rect_part_using_4x4_var_deviation =
        (cpi->sf.part_sf.prune_rect_part_using_4x4_var_deviation &&
         !x->must_find_valid_partition);

    if (bsize_at_least_16x16 || prune_rect_part_using_4x4_var_deviation) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      // Further pruning or in some cases reverse pruning when allintra is set.
      // This code helps visual and in some cases metrics quality where the
      // current block comprises at least one very low variance sub-block and at
      // least one where the variance is much higher.
      //
      // The idea is that in such cases there is danger of ringing and other
      // visual artifacts from a high variance feature such as an edge into a
      // very low variance region.
      //
      // The approach taken is to force break down / split to a smaller block
      // size to try and separate out the low variance and well predicted blocks
      // from the more complex ones and to prevent propagation of ringing over a
      // large region.
      if (bsize_at_least_16x16 && (var_min < 0.272) &&
          ((var_max - var_min) > 3.0)) {
        part_search_state.partition_none_allowed = 0;
        part_search_state.terminate_partition_search = 0;
        part_search_state.do_square_split = 1;
      } else if (prune_rect_part_using_4x4_var_deviation &&
                 (var_max - var_min < 3.0)) {
        // Prune rectangular partitions if the variance deviation of 4x4
        // sub-blocks within the block is less than a threshold (derived
        // empirically).
        part_search_state.do_rectangular_split = 0;
      }
    }
  }

  // PARTITION_NONE search stage.
  int64_t part_none_rd = INT64_MAX;
  none_partition_search(cpi, td, tile_data, x, pc_tree, sms_tree, &x_ctx,
                        &part_search_state, &best_rdc, &pb_source_variance,
                        none_rd, &part_none_rd);

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, none_partition_search_time);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, split_partition_search_time);
#endif
  // PARTITION_SPLIT search stage.
  int64_t part_split_rd = INT64_MAX;
  split_partition_search(cpi, td, tile_data, tp, x, pc_tree, sms_tree, &x_ctx,
                         &part_search_state, &best_rdc, multi_pass_mode,
                         &part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, split_partition_search_time);
#endif
  // Terminate partition search for child partition,
  // when NONE and SPLIT partition rd_costs are INT64_MAX.
  if (cpi->sf.part_sf.early_term_after_none_split &&
      part_none_rd == INT64_MAX && part_split_rd == INT64_MAX &&
      !x->must_find_valid_partition && (bsize != cm->seq_params->sb_size)) {
    part_search_state.terminate_partition_search = 1;
  }

  // Do not evaluate non-square partitions if NONE partition did not choose a
  // newmv mode and is skippable.
  if ((cpi->sf.part_sf.skip_non_sq_part_based_on_none >= 2) &&
      (pc_tree->none != NULL)) {
    if (x->qindex <= 200 && is_inter_mode(pc_tree->none->mic.mode) &&
        !have_newmv_in_inter_mode(pc_tree->none->mic.mode) &&
        pc_tree->none->skippable && !x->must_find_valid_partition &&
        bsize >= BLOCK_16X16)
      part_search_state.do_rectangular_split = 0;
  }

  // Prune partitions based on PARTITION_NONE and PARTITION_SPLIT.
  prune_partitions_after_split(cpi, x, sms_tree, &part_search_state, &best_rdc,
                               part_none_rd, part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rectangular_partition_search_time);
#endif
  // Rectangular partitions search stage.
  rectangular_partition_search(cpi, td, tile_data, tp, x, pc_tree, &x_ctx,
                               &part_search_state, &best_rdc,
                               rect_part_win_info, HORZ, VERT);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rectangular_partition_search_time);
#endif

  if (pb_source_variance == UINT_MAX) {
    av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);
    pb_source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part_search_state.do_rectangular_split));

  const int prune_ext_part_state = prune_ext_part_none_skippable(
      pc_tree->none, x->must_find_valid_partition,
      cpi->sf.part_sf.skip_non_sq_part_based_on_none, bsize);

  const int ab_partition_allowed = allow_ab_partition_search(
      &part_search_state, &cpi->sf.part_sf, pc_tree->partitioning,
      x->must_find_valid_partition, prune_ext_part_state, best_rdc.rdcost);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, ab_partitions_search_time);
#endif
  // AB partitions search stage.
  ab_partitions_search(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       &part_search_state, &best_rdc, rect_part_win_info,
                       pb_source_variance, ab_partition_allowed, HORZ_A,
                       VERT_B);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, ab_partitions_search_time);
#endif

  // 4-way partitions search stage.
  int part4_search_allowed[NUM_PART4_TYPES] = { 1, 1 };
  // Prune 4-way partition search.
  prune_4_way_partition_search(cpi, x, pc_tree, &part_search_state, &best_rdc,
                               pb_source_variance, prune_ext_part_state,
                               part4_search_allowed);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rd_pick_4partition_time);
#endif
  // PARTITION_HORZ_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[HORZ4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[HORZ4]) {
    const int inc_step[NUM_PART4_TYPES] = { mi_size_high[blk_params.bsize] / 4,
                                            0 };
    // Evaluation of Horz4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->horizontal4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_HORZ_4);
  }

  // PARTITION_VERT_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[VERT4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[VERT4] && blk_params.has_cols) {
    const int inc_step[NUM_PART4_TYPES] = { 0, mi_size_wide[blk_params.bsize] /
                                                   4 };
    // Evaluation of Vert4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->vertical4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_VERT_4);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rd_pick_4partition_time);
#endif

  if (bsize == cm->seq_params->sb_size &&
      !part_search_state.found_best_partition) {
    // Did not find a valid partition, go back and search again, with less
    // constraint on which partition types to search.
    x->must_find_valid_partition = 1;
#if CONFIG_COLLECT_PARTITION_STATS
    fr_part_timing_stats->partition_redo += 1;
#endif  // CONFIG_COLLECT_PARTITION_STATS
    goto BEGIN_PARTITION_SEARCH;
  }

  // Store the final rd cost
  *rd_cost = best_rdc;

  // Also record the best partition in simple motion data tree because it is
  // necessary for the related speed features.
  set_sms_tree_partitioning(sms_tree, pc_tree->partitioning);

#if CONFIG_COLLECT_PARTITION_STATS
  if (best_rdc.rate < INT_MAX && best_rdc.dist < INT64_MAX) {
    part_timing_stats->partition_decisions[pc_tree->partitioning] += 1;
  }

  // If CONFIG_COLLECT_PARTITION_STATS is 1, then print out the stats for each
  // prediction block.
  print_partition_timing_stats_with_rdcost(
      part_timing_stats, mi_row, mi_col, bsize,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
      cm->current_frame.frame_number, &best_rdc, "part_timing.csv");
  const bool print_timing_stats = false;
  if (print_timing_stats) {
    print_partition_timing_stats(part_timing_stats, cm->show_frame,
                                 frame_is_intra_only(cm), bsize,
                                 "part_timing_data.csv");
  }
  // If CONFIG_COLLECTION_PARTITION_STATS is 2, then we print out the stats for
  // the whole clip. So we need to pass the information upstream to the encoder.
  accumulate_partition_timing_stats(fr_part_timing_stats, part_timing_stats,
                                    bsize);
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Reset the PC_TREE deallocation flag.
  int pc_tree_dealloc = 0;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (part_search_state.found_best_partition) {
    if (bsize == cm->seq_params->sb_size) {
      // Encode the superblock.
      const int emit_output = multi_pass_mode != SB_DRY_PASS;
      const RUN_TYPE run_type = emit_output ? OUTPUT_ENABLED : DRY_RUN_NORMAL;

      // Write partition tree to file. Not used by default.
      if (COLLECT_MOTION_SEARCH_FEATURE_SB) {
        write_partition_tree(cpi, pc_tree, bsize, mi_row, mi_col);
        ++cpi->sb_counter;
      }

      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, run_type, bsize,
                pc_tree, NULL);
      assert(pc_tree == td->pc_root);
      // Dealloc the whole PC_TREE after a superblock is done.
      av1_free_pc_tree_recursive(pc_tree, num_planes, 0, 0,
                                 cpi->sf.part_sf.partition_search_type);
      pc_tree = NULL;
      td->pc_root = NULL;
      pc_tree_dealloc = 1;
    } else if (should_do_dry_run_encode_for_current_block(
                   cm->seq_params->sb_size, x->sb_enc.max_partition_size,
                   pc_tree->index, bsize)) {
      // Encode the smaller blocks in DRY_RUN mode.
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  // If the tree still exists (non-superblock), dealloc most nodes, only keep
  // nodes for the best partition and PARTITION_NONE.
  if (pc_tree_dealloc == 0)
    av1_free_pc_tree_recursive(pc_tree, num_planes, 1, 1,
                               cpi->sf.part_sf.partition_search_type);

  if (bsize == cm->seq_params->sb_size) {
    assert(best_rdc.rate < INT_MAX);
    assert(best_rdc.dist < INT64_MAX);
  } else {
    assert(tp_orig == *tp);
  }

  // Restore the rd multiplier.
  x->rdmult = orig_rdmult;
  return part_search_state.found_best_partition;
}